

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

UBool __thiscall icu_63::TextTrieMap::growNodes(TextTrieMap *this)

{
  CharacterNode *__dest;
  CharacterNode *newNodes;
  int32_t newCapacity;
  TextTrieMap *this_local;
  
  if (this->fNodesCapacity == 0xffff) {
    this_local._7_1_ = '\0';
  }
  else {
    newNodes._4_4_ = this->fNodesCapacity + 1000;
    if (0xffff < newNodes._4_4_) {
      newNodes._4_4_ = 0xffff;
    }
    __dest = (CharacterNode *)uprv_malloc_63((long)newNodes._4_4_ << 4);
    if (__dest == (CharacterNode *)0x0) {
      this_local._7_1_ = '\0';
    }
    else {
      memcpy(__dest,this->fNodes,(long)this->fNodesCount << 4);
      uprv_free_63(this->fNodes);
      this->fNodes = __dest;
      this->fNodesCapacity = newNodes._4_4_;
      this_local._7_1_ = '\x01';
    }
  }
  return this_local._7_1_;
}

Assistant:

UBool
TextTrieMap::growNodes() {
    if (fNodesCapacity == 0xffff) {
        return FALSE;  // We use 16-bit node indexes.
    }
    int32_t newCapacity = fNodesCapacity + 1000;
    if (newCapacity > 0xffff) {
        newCapacity = 0xffff;
    }
    CharacterNode *newNodes = (CharacterNode *)uprv_malloc(newCapacity * sizeof(CharacterNode));
    if (newNodes == NULL) {
        return FALSE;
    }
    uprv_memcpy(newNodes, fNodes, fNodesCount * sizeof(CharacterNode));
    uprv_free(fNodes);
    fNodes = newNodes;
    fNodesCapacity = newCapacity;
    return TRUE;
}